

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O3

void av1_nn_predict_c(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  int i_1;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  float *pfVar12;
  float fVar13;
  float local_438 [258];
  
  lVar5 = (long)nn_config->num_hidden_layers;
  if (lVar5 < 1) {
    uVar4 = (ulong)(uint)nn_config->num_inputs;
  }
  else {
    lVar10 = 0;
    uVar6 = 0;
    pfVar8 = input_nodes;
    uVar11 = nn_config->num_inputs;
    do {
      input_nodes = local_438 + uVar6 * 0x80;
      uVar1 = nn_config->num_hidden_nodes[lVar10];
      uVar4 = (ulong)(int)uVar1;
      if (0 < (long)uVar4) {
        pfVar12 = nn_config->weights[lVar10];
        pfVar3 = nn_config->bias[lVar10];
        uVar7 = 0;
        do {
          fVar13 = pfVar3[uVar7];
          if (0 < (int)uVar11) {
            uVar9 = 0;
            do {
              fVar13 = fVar13 + pfVar12[uVar9] * pfVar8[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          if (fVar13 <= 0.0) {
            fVar13 = 0.0;
          }
          input_nodes[uVar7] = fVar13;
          uVar7 = uVar7 + 1;
          pfVar12 = pfVar12 + uVar11;
        } while (uVar7 != uVar4);
      }
      uVar6 = (ulong)(1 - (int)uVar6);
      lVar10 = lVar10 + 1;
      pfVar8 = input_nodes;
      uVar11 = uVar1;
    } while (lVar10 != lVar5);
  }
  iVar2 = nn_config->num_outputs;
  lVar10 = (long)iVar2;
  if (0 < lVar10) {
    pfVar8 = nn_config->weights[lVar5];
    pfVar12 = nn_config->bias[lVar5];
    lVar5 = 0;
    do {
      fVar13 = pfVar12[lVar5];
      if (0 < (int)uVar4) {
        uVar6 = 0;
        do {
          fVar13 = fVar13 + pfVar8[uVar6] * input_nodes[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uVar4 & 0xffffffff) != uVar6);
      }
      output[lVar5] = fVar13;
      lVar5 = lVar5 + 1;
      pfVar8 = pfVar8 + (uVar4 & 0xffffffff);
    } while (lVar5 != lVar10);
    if (reduce_prec != 0 && 0 < iVar2) {
      lVar5 = 0;
      do {
        output[lVar5] = (float)(int)(output[lVar5] * 512.0 + 0.5) * 0.001953125;
        lVar5 = lVar5 + 1;
      } while (lVar10 != lVar5);
    }
  }
  return;
}

Assistant:

void av1_nn_predict_c(const float *input_nodes,
                      const NN_CONFIG *const nn_config, int reduce_prec,
                      float *const output) {
  int num_input_nodes = nn_config->num_inputs;
  int buf_index = 0;
  float buf[2][NN_MAX_NODES_PER_LAYER];

  // Propagate hidden layers.
  const int num_layers = nn_config->num_hidden_layers;
  assert(num_layers <= NN_MAX_HIDDEN_LAYERS);
  for (int layer = 0; layer < num_layers; ++layer) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    float *output_nodes = buf[buf_index];
    const int num_output_nodes = nn_config->num_hidden_nodes[layer];
    assert(num_output_nodes < NN_MAX_NODES_PER_LAYER);
    for (int node = 0; node < num_output_nodes; ++node) {
      float val = layer_bias[node];
      for (int i = 0; i < num_input_nodes; ++i)
        val += layer_weights[node * num_input_nodes + i] * input_nodes[i];
      // ReLU as activation function.
      val = val > 0.0f ? val : 0.0f;  // Could use AOMMAX().
      output_nodes[node] = val;
    }
    num_input_nodes = num_output_nodes;
    input_nodes = output_nodes;
    buf_index = 1 - buf_index;
  }

  // Final output layer.
  const float *layer_weights = nn_config->weights[num_layers];
  const float *layer_bias = nn_config->bias[num_layers];
  for (int node = 0; node < nn_config->num_outputs; ++node) {
    float val = layer_bias[node];
    for (int i = 0; i < num_input_nodes; ++i)
      val += layer_weights[node * num_input_nodes + i] * input_nodes[i];
    output[node] = val;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}